

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O2

bool SetGenericProperty<aiMatrix4x4t<float>>
               (map<unsigned_int,_aiMatrix4x4t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
                *list,char *szName,aiMatrix4x4t<float> *value)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  iterator iVar9;
  uint32_t hash;
  pair<unsigned_int,_aiMatrix4x4t<float>_> local_64;
  
  if (szName != (char *)0x0) {
    hash = SuperFastHash(szName,0,0);
    iVar9 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
            ::find(&list->_M_t,&hash);
    p_Var1 = &(list->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)iVar9._M_node == p_Var1) {
      local_64.first = hash;
      local_64.second.a1 = value->a1;
      local_64.second.a2 = value->a2;
      local_64.second.a3 = value->a3;
      local_64.second.a4 = value->a4;
      local_64.second.b1 = value->b1;
      local_64.second.b2 = value->b2;
      local_64.second.b3 = value->b3;
      local_64.second.b4 = value->b4;
      local_64.second.c1 = value->c1;
      local_64.second.c2 = value->c2;
      local_64.second.c3 = value->c3;
      local_64.second.c4 = value->c4;
      local_64.second.d1 = value->d1;
      local_64.second.d2 = value->d2;
      local_64.second.d3 = value->d3;
      local_64.second.d4 = value->d4;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,aiMatrix4x4t<float>>,std::_Select1st<std::pair<unsigned_int_const,aiMatrix4x4t<float>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,aiMatrix4x4t<float>>>>
      ::_M_emplace_unique<std::pair<unsigned_int,aiMatrix4x4t<float>>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,aiMatrix4x4t<float>>,std::_Select1st<std::pair<unsigned_int_const,aiMatrix4x4t<float>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,aiMatrix4x4t<float>>>>
                  *)list,&local_64);
    }
    else {
      uVar2 = *(undefined8 *)value;
      uVar3 = *(undefined8 *)&value->a3;
      uVar4 = *(undefined8 *)&value->b1;
      uVar5 = *(undefined8 *)&value->b3;
      uVar6 = *(undefined8 *)&value->c1;
      uVar7 = *(undefined8 *)&value->c3;
      uVar8 = *(undefined8 *)&value->d3;
      *(undefined8 *)((long)&iVar9._M_node[2]._M_left + 4) = *(undefined8 *)&value->d1;
      *(undefined8 *)((long)&iVar9._M_node[2]._M_right + 4) = uVar8;
      *(undefined8 *)&iVar9._M_node[2].field_0x4 = uVar6;
      *(undefined8 *)((long)&iVar9._M_node[2]._M_parent + 4) = uVar7;
      *(undefined8 *)((long)&iVar9._M_node[1]._M_left + 4) = uVar4;
      *(undefined8 *)((long)&iVar9._M_node[1]._M_right + 4) = uVar5;
      *(undefined8 *)&iVar9._M_node[1].field_0x4 = uVar2;
      *(undefined8 *)((long)&iVar9._M_node[1]._M_parent + 4) = uVar3;
    }
    return (_Rb_tree_header *)iVar9._M_node != p_Var1;
  }
  __assert_fail("nullptr != szName",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/GenericProperty.h"
                ,0x3e,
                "bool SetGenericProperty(std::map<unsigned int, T> &, const char *, const T &) [T = aiMatrix4x4t<float>]"
               );
}

Assistant:

inline
bool SetGenericProperty(std::map< unsigned int, T >& list,
        const char* szName, const T& value) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::iterator it = list.find(hash);
    if (it == list.end())   {
        list.insert(std::pair<unsigned int, T>( hash, value ));
        return false;
    }
    (*it).second = value;

    return true;
}